

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

bool __thiscall QAuthenticator::operator==(QAuthenticator *this,QAuthenticator *other)

{
  QAuthenticatorPrivate *pQVar1;
  QAuthenticatorPrivate *pQVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  
  pQVar1 = this->d;
  pQVar2 = other->d;
  if (pQVar1 == pQVar2) {
    bVar6 = true;
  }
  else {
    if (pQVar2 != (QAuthenticatorPrivate *)0x0 && pQVar1 != (QAuthenticatorPrivate *)0x0) {
      lVar3 = (pQVar1->user).d.size;
      lVar4 = (pQVar2->user).d.size;
      if (lVar3 == lVar4) {
        QVar7.m_data = (pQVar2->user).d.ptr;
        QVar7.m_size = lVar4;
        QVar10.m_data = (pQVar1->user).d.ptr;
        QVar10.m_size = lVar3;
        cVar5 = QtPrivate::equalStrings(QVar10,QVar7);
        if (cVar5 != '\0') {
          lVar3 = (pQVar1->password).d.size;
          lVar4 = (pQVar2->password).d.size;
          if (lVar3 == lVar4) {
            QVar8.m_data = (pQVar2->password).d.ptr;
            QVar8.m_size = lVar4;
            QVar11.m_data = (pQVar1->password).d.ptr;
            QVar11.m_size = lVar3;
            cVar5 = QtPrivate::equalStrings(QVar11,QVar8);
            if (cVar5 != '\0') {
              lVar3 = (pQVar1->realm).d.size;
              lVar4 = (pQVar2->realm).d.size;
              if (lVar3 == lVar4) {
                QVar9.m_data = (pQVar2->realm).d.ptr;
                QVar9.m_size = lVar4;
                QVar12.m_data = (pQVar1->realm).d.ptr;
                QVar12.m_size = lVar3;
                cVar5 = QtPrivate::equalStrings(QVar12,QVar9);
                if ((cVar5 != '\0') && (pQVar1->method == pQVar2->method)) {
                  bVar6 = comparesEqual<QString,_QVariant,_true>(&pQVar1->options,&pQVar2->options);
                  return bVar6;
                }
              }
            }
          }
        }
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool QAuthenticator::operator==(const QAuthenticator &other) const
{
    if (d == other.d)
        return true;
    if (!d || !other.d)
        return false;
    return d->user == other.d->user
        && d->password == other.d->password
        && d->realm == other.d->realm
        && d->method == other.d->method
        && d->options == other.d->options;
}